

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_>::addStorage
          (Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *this)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  undefined8 uVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  Entry *pEVar19;
  Entry *pEVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar49;
  undefined1 auVar47 [16];
  int iVar50;
  undefined1 auVar48 [16];
  int iVar51;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar75;
  undefined1 auVar74 [16];
  int iVar76;
  long lVar77;
  long lVar85;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  long lVar86;
  long lVar87;
  
  bVar3 = this->allocated;
  if (bVar3 == 0) {
    lVar18 = 0x30;
  }
  else if (bVar3 == 0x30) {
    lVar18 = 0x50;
  }
  else {
    lVar18 = (ulong)bVar3 + 0x10;
  }
  pEVar19 = (Entry *)operator_new__(lVar18 * 0x70);
  uVar24 = (ulong)this->allocated;
  if (uVar24 != 0) {
    lVar23 = 0x20;
    uVar22 = 0;
    do {
      pEVar20 = this->entries;
      *(undefined4 *)((pEVar19->storage).data + lVar23 + -0x20) =
           *(undefined4 *)((pEVar20->storage).data + lVar23 + -0x20);
      *(undefined8 *)((pEVar19->storage).data + lVar23 + -0x18) =
           *(undefined8 *)((pEVar20->storage).data + lVar23 + -0x18);
      uVar4 = *(undefined8 *)((pEVar20->storage).data + lVar23 + -0x10);
      puVar1 = (pEVar20->storage).data + lVar23 + -0x10;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)((pEVar19->storage).data + lVar23 + -0x10) = uVar4;
      uVar4 = *(undefined8 *)((pEVar20->storage).data + lVar23 + -8);
      puVar1 = (pEVar20->storage).data + lVar23 + -8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)((pEVar19->storage).data + lVar23 + -8) = uVar4;
      uVar4 = *(undefined8 *)((pEVar20->storage).data + lVar23);
      puVar1 = (pEVar20->storage).data + lVar23;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)((pEVar19->storage).data + lVar23) = uVar4;
      uVar4 = *(undefined8 *)((pEVar20->storage).data + lVar23 + 8);
      puVar1 = (pEVar20->storage).data + lVar23 + 8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)((pEVar19->storage).data + lVar23 + 8) = uVar4;
      uVar4 = *(undefined8 *)((pEVar20->storage).data + lVar23 + 0x10);
      puVar1 = (pEVar20->storage).data + lVar23 + 0x10;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)((pEVar19->storage).data + lVar23 + 0x10) = uVar4;
      (pEVar19->storage).data[lVar23 + 0x48] = (pEVar20->storage).data[lVar23 + 0x48];
      puVar1 = (pEVar20->storage).data + lVar23 + 0x18;
      uVar4 = *(undefined8 *)puVar1;
      uVar14 = *(undefined8 *)(puVar1 + 8);
      puVar1 = (pEVar20->storage).data + lVar23 + 0x28;
      uVar15 = *(undefined8 *)puVar1;
      uVar16 = *(undefined8 *)(puVar1 + 8);
      puVar1 = (pEVar20->storage).data + lVar23 + 0x38;
      uVar17 = *(undefined8 *)(puVar1 + 8);
      puVar2 = (pEVar19->storage).data + lVar23 + 0x38;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 8) = uVar17;
      puVar1 = (pEVar19->storage).data + lVar23 + 0x28;
      *(undefined8 *)puVar1 = uVar15;
      *(undefined8 *)(puVar1 + 8) = uVar16;
      puVar1 = (pEVar19->storage).data + lVar23 + 0x18;
      *(undefined8 *)puVar1 = uVar4;
      *(undefined8 *)(puVar1 + 8) = uVar14;
      pEVar20 = this->entries;
      piVar5 = *(int **)((pEVar20->storage).data + lVar23);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate(*(QArrayData **)((pEVar20->storage).data + lVar23),0x18,0x10);
        }
      }
      QHash<int,_QPointF>::~QHash((QHash<int,_QPointF> *)((pEVar20->storage).data + lVar23 + -8));
      QHash<int,_QWindowSystemInterface::TouchPoint>::~QHash
                ((QHash<int,_QWindowSystemInterface::TouchPoint> *)
                 ((pEVar20->storage).data + lVar23 + -0x10));
      uVar22 = uVar22 + 1;
      uVar24 = (ulong)this->allocated;
      lVar23 = lVar23 + 0x70;
    } while (uVar22 < uVar24);
  }
  if ((uint)uVar24 < (uint)lVar18) {
    lVar23 = lVar18 - uVar24;
    lVar21 = lVar23 + -1;
    lVar77 = uVar24 + 0xe;
    lVar85 = uVar24 + 0xf;
    lVar35 = uVar24 + 0xc;
    lVar36 = uVar24 + 0xd;
    lVar37 = uVar24 + 10;
    lVar38 = uVar24 + 0xb;
    lVar39 = uVar24 + 8;
    lVar40 = uVar24 + 9;
    lVar41 = uVar24 + 6;
    lVar42 = uVar24 + 7;
    lVar43 = uVar24 + 4;
    lVar44 = uVar24 + 5;
    lVar86 = uVar24 + 2;
    lVar87 = uVar24 + 3;
    lVar25 = uVar24 + 1;
    auVar26._8_4_ = (int)lVar21;
    auVar26._0_8_ = lVar21;
    auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
    pEVar20 = pEVar19 + uVar24;
    uVar22 = 0;
    do {
      auVar74._8_4_ = (int)uVar22;
      auVar74._0_8_ = uVar22;
      auVar74._12_4_ = (int)(uVar22 >> 0x20);
      auVar47 = auVar26 ^ _DAT_00193900;
      auVar45 = (auVar74 | _DAT_001938f0) ^ _DAT_00193900;
      iVar75 = auVar47._0_4_;
      iVar51 = -(uint)(iVar75 < auVar45._0_4_);
      iVar76 = auVar47._4_4_;
      iVar62 = -(uint)(iVar76 < auVar45._4_4_);
      iVar49 = auVar47._8_4_;
      iVar63 = -(uint)(iVar49 < auVar45._8_4_);
      iVar50 = auVar47._12_4_;
      iVar64 = -(uint)(iVar50 < auVar45._12_4_);
      auVar78._4_4_ = iVar51;
      auVar78._0_4_ = iVar51;
      auVar78._8_4_ = iVar63;
      auVar78._12_4_ = iVar63;
      auVar70 = pshuflw(in_XMM12,auVar78,0xe8);
      auVar52._4_4_ = -(uint)(auVar45._4_4_ == iVar76);
      auVar52._12_4_ = -(uint)(auVar45._12_4_ == iVar50);
      auVar52._0_4_ = auVar52._4_4_;
      auVar52._8_4_ = auVar52._12_4_;
      auVar65 = pshuflw(in_XMM10,auVar52,0xe8);
      auVar46._4_4_ = iVar62;
      auVar46._0_4_ = iVar62;
      auVar46._8_4_ = iVar64;
      auVar46._12_4_ = iVar64;
      auVar47 = pshuflw(_DAT_00193900,auVar46,0xe8);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar47 | auVar65 & auVar70) ^ auVar45;
      auVar45 = packssdw(auVar45,auVar45);
      if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (pEVar20->storage).data[0] = (char)uVar24 + '\x01';
      }
      auVar46 = auVar52 & auVar78 | auVar46;
      auVar45 = packssdw(auVar46,auVar46);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar47,auVar45 ^ auVar47);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._0_4_ >> 8 & 1) != 0) {
        pEVar20[1].storage.data[0] = (char)lVar25 + '\x01';
      }
      auVar45 = (auVar74 | _DAT_001938e0) ^ _DAT_00193900;
      iVar51 = -(uint)(iVar75 < auVar45._0_4_);
      iVar63 = -(uint)(iVar76 < auVar45._4_4_);
      iVar62 = -(uint)(iVar49 < auVar45._8_4_);
      iVar64 = -(uint)(iVar50 < auVar45._12_4_);
      auVar70._4_4_ = iVar51;
      auVar70._0_4_ = iVar51;
      auVar70._8_4_ = iVar62;
      auVar70._12_4_ = iVar62;
      iVar51 = -(uint)(auVar45._4_4_ == iVar76);
      iVar62 = -(uint)(auVar45._12_4_ == iVar50);
      auVar79._4_4_ = iVar51;
      auVar79._0_4_ = iVar51;
      auVar79._8_4_ = iVar62;
      auVar79._12_4_ = iVar62;
      auVar71._4_4_ = iVar63;
      auVar71._0_4_ = iVar63;
      auVar71._8_4_ = iVar64;
      auVar71._12_4_ = iVar64;
      auVar45 = auVar79 & auVar70 | auVar71;
      auVar45 = packssdw(auVar45,auVar45);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar65,auVar45 ^ auVar65);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._0_4_ >> 0x10 & 1) != 0) {
        pEVar20[2].storage.data[0] = (char)lVar86 + '\x01';
      }
      auVar45 = pshufhw(auVar45,auVar70,0x84);
      auVar52 = pshufhw(auVar70,auVar79,0x84);
      auVar47 = pshufhw(auVar45,auVar71,0x84);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar47 | auVar52 & auVar45) ^ auVar27;
      auVar45 = packssdw(auVar27,auVar27);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._0_4_ >> 0x18 & 1) != 0) {
        pEVar20[3].storage.data[0] = (char)lVar87 + '\x01';
      }
      auVar45 = (auVar74 | _DAT_001938d0) ^ _DAT_00193900;
      auVar66._0_4_ = -(uint)(iVar75 < auVar45._0_4_);
      auVar66._4_4_ = -(uint)(iVar76 < auVar45._4_4_);
      auVar66._8_4_ = -(uint)(iVar49 < auVar45._8_4_);
      auVar66._12_4_ = -(uint)(iVar50 < auVar45._12_4_);
      auVar80._4_4_ = auVar66._0_4_;
      auVar80._0_4_ = auVar66._0_4_;
      auVar80._8_4_ = auVar66._8_4_;
      auVar80._12_4_ = auVar66._8_4_;
      auVar52 = pshuflw(auVar71,auVar80,0xe8);
      auVar28._0_4_ = -(uint)(auVar45._0_4_ == iVar75);
      auVar28._4_4_ = -(uint)(auVar45._4_4_ == iVar76);
      auVar28._8_4_ = -(uint)(auVar45._8_4_ == iVar49);
      auVar28._12_4_ = -(uint)(auVar45._12_4_ == iVar50);
      auVar53._4_4_ = auVar28._4_4_;
      auVar53._0_4_ = auVar28._4_4_;
      auVar53._8_4_ = auVar28._12_4_;
      auVar53._12_4_ = auVar28._12_4_;
      auVar45 = pshuflw(auVar28,auVar53,0xe8);
      auVar54._4_4_ = auVar66._4_4_;
      auVar54._0_4_ = auVar66._4_4_;
      auVar54._8_4_ = auVar66._12_4_;
      auVar54._12_4_ = auVar66._12_4_;
      auVar47 = pshuflw(auVar66,auVar54,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 & auVar52,(auVar47 | auVar45 & auVar52) ^ auVar6);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pEVar20[4].storage.data[0] = (char)lVar43 + '\x01';
      }
      auVar54 = auVar53 & auVar80 | auVar54;
      auVar47 = packssdw(auVar54,auVar54);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45,auVar47 ^ auVar7);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._4_2_ >> 8 & 1) != 0) {
        pEVar20[5].storage.data[0] = (char)lVar44 + '\x01';
      }
      auVar45 = (auVar74 | _DAT_001938c0) ^ _DAT_00193900;
      iVar51 = -(uint)(iVar75 < auVar45._0_4_);
      iVar63 = -(uint)(iVar76 < auVar45._4_4_);
      iVar62 = -(uint)(iVar49 < auVar45._8_4_);
      iVar64 = -(uint)(iVar50 < auVar45._12_4_);
      auVar55._4_4_ = iVar51;
      auVar55._0_4_ = iVar51;
      auVar55._8_4_ = iVar62;
      auVar55._12_4_ = iVar62;
      iVar51 = -(uint)(auVar45._4_4_ == iVar76);
      iVar62 = -(uint)(auVar45._12_4_ == iVar50);
      auVar72._4_4_ = iVar51;
      auVar72._0_4_ = iVar51;
      auVar72._8_4_ = iVar62;
      auVar72._12_4_ = iVar62;
      auVar81._4_4_ = iVar63;
      auVar81._0_4_ = iVar63;
      auVar81._8_4_ = iVar64;
      auVar81._12_4_ = iVar64;
      auVar45 = auVar72 & auVar55 | auVar81;
      auVar45 = packssdw(auVar45,auVar45);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar8,auVar45 ^ auVar8);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pEVar20[6].storage.data[0] = (char)lVar41 + '\x01';
      }
      auVar45 = pshufhw(auVar45,auVar55,0x84);
      auVar52 = pshufhw(auVar55,auVar72,0x84);
      auVar47 = pshufhw(auVar45,auVar81,0x84);
      auVar29._8_4_ = 0xffffffff;
      auVar29._0_8_ = 0xffffffffffffffff;
      auVar29._12_4_ = 0xffffffff;
      auVar29 = (auVar47 | auVar52 & auVar45) ^ auVar29;
      auVar45 = packssdw(auVar29,auVar29);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._6_2_ >> 8 & 1) != 0) {
        pEVar20[7].storage.data[0] = (char)lVar42 + '\x01';
      }
      auVar45 = (auVar74 | _DAT_001938b0) ^ _DAT_00193900;
      auVar67._0_4_ = -(uint)(iVar75 < auVar45._0_4_);
      auVar67._4_4_ = -(uint)(iVar76 < auVar45._4_4_);
      auVar67._8_4_ = -(uint)(iVar49 < auVar45._8_4_);
      auVar67._12_4_ = -(uint)(iVar50 < auVar45._12_4_);
      auVar82._4_4_ = auVar67._0_4_;
      auVar82._0_4_ = auVar67._0_4_;
      auVar82._8_4_ = auVar67._8_4_;
      auVar82._12_4_ = auVar67._8_4_;
      auVar52 = pshuflw(auVar72,auVar82,0xe8);
      auVar30._0_4_ = -(uint)(auVar45._0_4_ == iVar75);
      auVar30._4_4_ = -(uint)(auVar45._4_4_ == iVar76);
      auVar30._8_4_ = -(uint)(auVar45._8_4_ == iVar49);
      auVar30._12_4_ = -(uint)(auVar45._12_4_ == iVar50);
      auVar56._4_4_ = auVar30._4_4_;
      auVar56._0_4_ = auVar30._4_4_;
      auVar56._8_4_ = auVar30._12_4_;
      auVar56._12_4_ = auVar30._12_4_;
      auVar45 = pshuflw(auVar30,auVar56,0xe8);
      auVar57._4_4_ = auVar67._4_4_;
      auVar57._0_4_ = auVar67._4_4_;
      auVar57._8_4_ = auVar67._12_4_;
      auVar57._12_4_ = auVar67._12_4_;
      auVar47 = pshuflw(auVar67,auVar57,0xe8);
      auVar68._8_4_ = 0xffffffff;
      auVar68._0_8_ = 0xffffffffffffffff;
      auVar68._12_4_ = 0xffffffff;
      auVar68 = (auVar47 | auVar45 & auVar52) ^ auVar68;
      auVar47 = packssdw(auVar68,auVar68);
      auVar45 = packsswb(auVar45 & auVar52,auVar47);
      if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar20[8].storage.data[0] = (char)lVar39 + '\x01';
      }
      auVar57 = auVar56 & auVar82 | auVar57;
      auVar47 = packssdw(auVar57,auVar57);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar47 = packssdw(auVar47 ^ auVar9,auVar47 ^ auVar9);
      auVar45 = packsswb(auVar45,auVar47);
      if ((auVar45._8_2_ >> 8 & 1) != 0) {
        pEVar20[9].storage.data[0] = (char)lVar40 + '\x01';
      }
      auVar45 = (auVar74 | _DAT_001938a0) ^ _DAT_00193900;
      iVar51 = -(uint)(iVar75 < auVar45._0_4_);
      iVar63 = -(uint)(iVar76 < auVar45._4_4_);
      iVar62 = -(uint)(iVar49 < auVar45._8_4_);
      iVar64 = -(uint)(iVar50 < auVar45._12_4_);
      auVar58._4_4_ = iVar51;
      auVar58._0_4_ = iVar51;
      auVar58._8_4_ = iVar62;
      auVar58._12_4_ = iVar62;
      iVar51 = -(uint)(auVar45._4_4_ == iVar76);
      iVar62 = -(uint)(auVar45._12_4_ == iVar50);
      auVar73._4_4_ = iVar51;
      auVar73._0_4_ = iVar51;
      auVar73._8_4_ = iVar62;
      auVar73._12_4_ = iVar62;
      auVar83._4_4_ = iVar63;
      auVar83._0_4_ = iVar63;
      auVar83._8_4_ = iVar64;
      auVar83._12_4_ = iVar64;
      auVar45 = auVar73 & auVar58 | auVar83;
      auVar45 = packssdw(auVar45,auVar45);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar10,auVar45 ^ auVar10);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pEVar20[10].storage.data[0] = (char)lVar37 + '\x01';
      }
      auVar45 = pshufhw(auVar45,auVar58,0x84);
      auVar52 = pshufhw(auVar58,auVar73,0x84);
      auVar47 = pshufhw(auVar45,auVar83,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar47 | auVar52 & auVar45) ^ auVar31;
      auVar45 = packssdw(auVar31,auVar31);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._10_2_ >> 8 & 1) != 0) {
        pEVar20[0xb].storage.data[0] = (char)lVar38 + '\x01';
      }
      auVar45 = (auVar74 | _DAT_00193890) ^ _DAT_00193900;
      auVar69._0_4_ = -(uint)(iVar75 < auVar45._0_4_);
      auVar69._4_4_ = -(uint)(iVar76 < auVar45._4_4_);
      auVar69._8_4_ = -(uint)(iVar49 < auVar45._8_4_);
      auVar69._12_4_ = -(uint)(iVar50 < auVar45._12_4_);
      auVar84._4_4_ = auVar69._0_4_;
      auVar84._0_4_ = auVar69._0_4_;
      auVar84._8_4_ = auVar69._8_4_;
      auVar84._12_4_ = auVar69._8_4_;
      auVar52 = pshuflw(auVar73,auVar84,0xe8);
      auVar32._0_4_ = -(uint)(auVar45._0_4_ == iVar75);
      auVar32._4_4_ = -(uint)(auVar45._4_4_ == iVar76);
      auVar32._8_4_ = -(uint)(auVar45._8_4_ == iVar49);
      auVar32._12_4_ = -(uint)(auVar45._12_4_ == iVar50);
      auVar59._4_4_ = auVar32._4_4_;
      auVar59._0_4_ = auVar32._4_4_;
      auVar59._8_4_ = auVar32._12_4_;
      auVar59._12_4_ = auVar32._12_4_;
      auVar45 = pshuflw(auVar32,auVar59,0xe8);
      auVar60._4_4_ = auVar69._4_4_;
      auVar60._0_4_ = auVar69._4_4_;
      auVar60._8_4_ = auVar69._12_4_;
      auVar60._12_4_ = auVar69._12_4_;
      auVar47 = pshuflw(auVar69,auVar60,0xe8);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 & auVar52,(auVar47 | auVar45 & auVar52) ^ auVar11);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pEVar20[0xc].storage.data[0] = (char)lVar35 + '\x01';
      }
      auVar60 = auVar59 & auVar84 | auVar60;
      auVar47 = packssdw(auVar60,auVar60);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45,auVar47 ^ auVar12);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._12_2_ >> 8 & 1) != 0) {
        pEVar20[0xd].storage.data[0] = (char)lVar36 + '\x01';
      }
      auVar45 = (auVar74 | _DAT_00193880) ^ _DAT_00193900;
      auVar33._0_4_ = -(uint)(iVar75 < auVar45._0_4_);
      auVar33._4_4_ = -(uint)(iVar76 < auVar45._4_4_);
      auVar33._8_4_ = -(uint)(iVar49 < auVar45._8_4_);
      auVar33._12_4_ = -(uint)(iVar50 < auVar45._12_4_);
      auVar61._4_4_ = auVar33._0_4_;
      auVar61._0_4_ = auVar33._0_4_;
      auVar61._8_4_ = auVar33._8_4_;
      auVar61._12_4_ = auVar33._8_4_;
      iVar75 = -(uint)(auVar45._4_4_ == iVar76);
      iVar76 = -(uint)(auVar45._12_4_ == iVar50);
      auVar48._4_4_ = iVar75;
      auVar48._0_4_ = iVar75;
      auVar48._8_4_ = iVar76;
      auVar48._12_4_ = iVar76;
      in_XMM12._4_4_ = auVar33._4_4_;
      in_XMM12._0_4_ = auVar33._4_4_;
      in_XMM12._8_4_ = auVar33._12_4_;
      in_XMM12._12_4_ = auVar33._12_4_;
      in_XMM10 = auVar48 & auVar61 | in_XMM12;
      auVar45 = packssdw(auVar33,in_XMM10);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar13,auVar45 ^ auVar13);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pEVar20[0xe].storage.data[0] = (char)lVar77 + '\x01';
      }
      auVar45 = pshufhw(auVar45,auVar61,0x84);
      auVar52 = pshufhw(auVar48,auVar48,0x84);
      auVar47 = pshufhw(auVar45,in_XMM12,0x84);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar47 | auVar52 & auVar45) ^ auVar34;
      auVar45 = packssdw(auVar34,auVar34);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._14_2_ >> 8 & 1) != 0) {
        pEVar20[0xf].storage.data[0] = (char)lVar85 + '\x01';
      }
      uVar22 = uVar22 + 0x10;
      uVar24 = uVar24 + 0x10;
      lVar25 = lVar25 + 0x10;
      lVar86 = lVar86 + 0x10;
      lVar87 = lVar87 + 0x10;
      lVar43 = lVar43 + 0x10;
      lVar44 = lVar44 + 0x10;
      lVar41 = lVar41 + 0x10;
      lVar42 = lVar42 + 0x10;
      lVar39 = lVar39 + 0x10;
      lVar40 = lVar40 + 0x10;
      lVar37 = lVar37 + 0x10;
      lVar38 = lVar38 + 0x10;
      lVar35 = lVar35 + 0x10;
      lVar36 = lVar36 + 0x10;
      lVar77 = lVar77 + 0x10;
      lVar85 = lVar85 + 0x10;
      pEVar20 = pEVar20 + 0x10;
    } while ((lVar23 + 0xfU & 0xfffffffffffffff0) != uVar22);
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar19;
  this->allocated = (uchar)lVar18;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }